

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_block_scalar_hints(yaml_emitter_t *emitter,yaml_string_t string)

{
  yaml_string_t yVar1;
  int iVar2;
  byte *pbVar3;
  char *local_28;
  char *chomp_hint;
  yaml_emitter_t *pyStack_18;
  char indent_hint [2];
  yaml_emitter_t *emitter_local;
  
  yVar1 = string;
  local_28 = (char *)0x0;
  pyStack_18 = emitter;
  if ((((((*string.pointer == ' ') || (*string.pointer == '\r')) || (*string.pointer == '\n')) ||
       ((*string.pointer == 0xc2 && (string.pointer[1] == 0x85)))) ||
      ((*string.pointer == 0xe2 && ((string.pointer[1] == 0x80 && (string.pointer[2] == 0xa8))))))
     || ((*string.pointer == 0xe2 && ((string.pointer[1] == 0x80 && (string.pointer[2] == 0xa9))))))
  {
    chomp_hint._6_1_ = (char)emitter->best_indent + '0';
    chomp_hint._7_1_ = 0;
    iVar2 = yaml_emitter_write_indicator(emitter,(char *)((long)&chomp_hint + 6),0,0,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pyStack_18->open_ended = 0;
  string.pointer = string.end;
  string.start = yVar1.start;
  pbVar3 = string.pointer;
  if (string.start == string.end) {
    local_28 = "-";
  }
  else {
    do {
      string.pointer = pbVar3;
      pbVar3 = string.pointer + -1;
    } while ((*pbVar3 & 0xc0) == 0x80);
    if ((((*pbVar3 == 0xd) || (*pbVar3 == 10)) || ((*pbVar3 == 0xc2 && (*string.pointer == 0x85))))
       || ((((*pbVar3 == 0xe2 && (*string.pointer == 0x80)) && (string.pointer[1] == 0xa8)) ||
           (((*pbVar3 == 0xe2 && (*string.pointer == 0x80)) && (string.pointer[1] == 0xa9)))))) {
      if (string.start == pbVar3) {
        local_28 = "+";
        pyStack_18->open_ended = 1;
      }
      else {
        do {
          string.pointer = pbVar3;
          pbVar3 = string.pointer + -1;
        } while ((*pbVar3 & 0xc0) == 0x80);
        if (((((*pbVar3 == 0xd) || (*pbVar3 == 10)) ||
             ((*pbVar3 == 0xc2 && (*string.pointer == 0x85)))) ||
            (((*pbVar3 == 0xe2 && (*string.pointer == 0x80)) && (string.pointer[1] == 0xa8)))) ||
           (((*pbVar3 == 0xe2 && (*string.pointer == 0x80)) && (string.pointer[1] == 0xa9)))) {
          local_28 = "+";
          pyStack_18->open_ended = 1;
        }
      }
    }
    else {
      local_28 = "-";
    }
  }
  if ((local_28 == (char *)0x0) ||
     (iVar2 = yaml_emitter_write_indicator(pyStack_18,local_28,0,0,0), iVar2 != 0)) {
    emitter_local._4_4_ = 1;
  }
  else {
    emitter_local._4_4_ = 0;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_write_block_scalar_hints(yaml_emitter_t *emitter,
        yaml_string_t string)
{
    char indent_hint[2];
    const char *chomp_hint = NULL;

    if (IS_SPACE(string) || IS_BREAK(string))
    {
        indent_hint[0] = '0' + (char)emitter->best_indent;
        indent_hint[1] = '\0';
        if (!yaml_emitter_write_indicator(emitter, indent_hint, 0, 0, 0))
            return 0;
    }

    emitter->open_ended = 0;

    string.pointer = string.end;
    if (string.start == string.pointer)
    {
        chomp_hint = "-";
    }
    else
    {
        do {
            string.pointer --;
        } while ((*string.pointer & 0xC0) == 0x80);
        if (!IS_BREAK(string))
        {
            chomp_hint = "-";
        }
        else if (string.start == string.pointer)
        {
            chomp_hint = "+";
            emitter->open_ended = 1;
        }
        else
        {
            do {
                string.pointer --;
            } while ((*string.pointer & 0xC0) == 0x80);
            if (IS_BREAK(string))
            {
                chomp_hint = "+";
                emitter->open_ended = 1;
            }
        }
    }

    if (chomp_hint)
    {
        if (!yaml_emitter_write_indicator(emitter, chomp_hint, 0, 0, 0))
            return 0;
    }

    return 1;
}